

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O2

void draw_right_arrow(int left,int top,int width,int height,Am_Widget_Look look,bool depressed,
                     bool active,Computed_Colors_Record *color_rec,Am_Drawonable *draw)

{
  uint uVar1;
  Am_Style *prev;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  am_rect arrow_rect;
  Am_Style fill1;
  Am_Style line2;
  Am_Style line1;
  
  if (look.value == Am_MACINTOSH_LOOK_val) {
    arrow_rect.width = width;
    arrow_rect.height = height;
    arrow_rect.left = left;
    arrow_rect.top = top;
    draw_mac_arrow_box(arrow_rect,active,color_rec,draw);
    if (active) {
      if (depressed) {
        prev = &Am_Black;
      }
      else {
        prev = &color_rec->data->background_style;
      }
    }
    else {
      prev = &color_rec->data->foreground_style;
    }
    Am_Style::Am_Style(&fill1,prev);
    uVar1 = left + 7;
    uVar3 = (ulong)uVar1;
    (*draw->_vptr_Am_Drawonable[0x2b])
              (draw,&color_rec->data->shadow_style,&fill1,uVar3,(ulong)(top + 2),(ulong)uVar1,
               (ulong)(top + 0xc),(ulong)(left + 0xc),(ulong)(top + 7),uVar3,(ulong)(top + 2),0);
    (*draw->_vptr_Am_Drawonable[0x2b])
              (draw,&color_rec->data->shadow_style,&fill1,uVar3,(ulong)(top + 5),(ulong)(left + 3),
               (ulong)(top + 5),(ulong)(left + 3),(ulong)(top + 9),uVar3,(ulong)(top + 9),0);
    (*draw->_vptr_Am_Drawonable[0x28])
              (draw,&fill1,(ulong)uVar1,(ulong)(top + 6),(ulong)uVar1,(ulong)(top + 8),0);
  }
  else {
    if (look.value == Am_WINDOWS_LOOK_val) {
      draw_win_arrow_box((am_rect)CONCAT88(CONCAT44(height,width),CONCAT44(top,left)),depressed,
                         false,color_rec,draw);
      uVar1 = left + (uint)depressed + 6;
      uVar5 = top + 4 + (uint)depressed;
      uVar2 = top + 10 + (uint)depressed;
      for (iVar4 = 6; iVar4 != -2; iVar4 = iVar4 + -2) {
        (*draw->_vptr_Am_Drawonable[0x28])
                  (draw,&Am_Black,(ulong)uVar1,(ulong)uVar5,(ulong)uVar1,(ulong)uVar2,0);
        uVar2 = uVar2 - 1;
        uVar5 = uVar5 + 1;
        uVar1 = uVar1 + 1;
      }
      return;
    }
    if (look.value != Am_MOTIF_LOOK_val) {
      Am_Error("Unknown Look parameter");
    }
    Am_Style::Am_Style(&fill1,&color_rec->data->foreground_style + depressed);
    Am_Style::Am_Style(&line1,&color_rec->data->shadow_style + !depressed);
    Am_Style::Am_Style(&line2,&color_rec->data->shadow_style + depressed);
    uVar1 = height / 2 + top;
    uVar3 = (ulong)((left + width) - 1);
    uVar2 = height + -1 + top;
    (*draw->_vptr_Am_Drawonable[0x2a])
              (draw,&line1,&Am_No_Style,(ulong)(uint)left,(ulong)uVar2,(ulong)(uint)left,
               (ulong)(top + 1),uVar3,(ulong)uVar1,0);
    (*draw->_vptr_Am_Drawonable[0x28])
              (draw,&line2,(ulong)(uint)left,(ulong)uVar2,uVar3,(ulong)uVar1,0);
    uVar5 = left + 1;
    uVar2 = (height + top) - 2;
    uVar3 = (ulong)((width + left) - 2);
    (*draw->_vptr_Am_Drawonable[0x2a])
              (draw,&line1,&fill1,(ulong)uVar5,(ulong)uVar2,(ulong)uVar5,(ulong)(top + 2),uVar3,
               (ulong)uVar1,0);
    (*draw->_vptr_Am_Drawonable[0x28])(draw,&line2,(ulong)uVar5,(ulong)uVar2,uVar3,(ulong)uVar1,0);
    Am_Style::~Am_Style(&line2);
    Am_Style::~Am_Style(&line1);
  }
  Am_Style::~Am_Style(&fill1);
  return;
}

Assistant:

void
draw_right_arrow(int left, int top, int width, int height, Am_Widget_Look look,
                 bool depressed, bool active,
                 const Computed_Colors_Record &color_rec, Am_Drawonable *draw)
{
  am_rect arrow_rect(left, top, width, height);
  switch (look.value) {
  case Am_MOTIF_LOOK_val: {
    const Am_Style fill1(depressed ? color_rec.data->background_style
                                   : color_rec.data->foreground_style);
    const Am_Style line1(depressed ? color_rec.data->shadow_style
                                   : color_rec.data->highlight_style);
    const Am_Style line2(depressed ? color_rec.data->highlight_style
                                   : color_rec.data->shadow_style);

    int center_y = top + height / 2;
    int right = left + width - 1;
    int bottom = top + height - 1;

    //top line
    draw->Draw_2_Lines(line1, Am_No_Style, left, bottom, left, top + 1, right,
                       center_y);
    //bottom line
    draw->Draw_Line(line2, left, bottom, right, center_y);
    //top line
    draw->Draw_2_Lines(line1, fill1, left + 1, bottom - 1, left + 1, top + 2,
                       right - 1, center_y);
    //bottom line
    draw->Draw_Line(line2, left + 1, bottom - 1, right - 1, center_y);
    break;
  }

  case Am_WINDOWS_LOOK_val: {
    draw_win_arrow_box(arrow_rect, depressed, false, color_rec, draw);

    int a_top = !depressed ? 4 : 5, a_left = !depressed ? 6 : 7, a_width = 4,
        a_height = 6; // actually 7, because of pixel drawing

    for (int x = 0; x < a_width; x++) {
      draw->Draw_Line(Am_Black, left + a_left + x, top + a_top,
                      left + a_left + x, top + a_top + a_height);
      a_top++;
      a_height -= 2;
    }
    break;
  }

  case Am_MACINTOSH_LOOK_val: {
    draw_mac_arrow_box(arrow_rect, active, color_rec, draw);

    Am_Style fill_style =
        (active) ? (!depressed ? color_rec.data->background_style : Am_Black)
                 : color_rec.data->foreground_style;
    draw->Draw_3_Lines(color_rec.data->shadow_style, fill_style, left + 7,
                       top + 2, left + 7, top + 12, left + 12, top + 7,
                       left + 7, top + 2);
    draw->Draw_3_Lines(color_rec.data->shadow_style, fill_style, left + 7,
                       top + 5, left + 3, top + 5, left + 3, top + 9, left + 7,
                       top + 9);
    draw->Draw_Line(fill_style, left + 7, top + 6, left + 7, top + 8);
    break;
  }

  default:
    Am_Error("Unknown Look parameter");
    break;
  }
}